

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_stack_check(ASMState *as,BCReg topslot,IRIns *irp,RegSet allow,ExitNo exitno)

{
  MCode *pMVar1;
  uint rb;
  uint rb_00;
  uint r2;
  
  if (irp == (IRIns *)0x0) {
    r2 = 2;
  }
  else {
    r2 = (uint)(irp->field_1).r;
  }
  rb = 0;
  if (allow != 0) {
    for (; (allow >> rb & 1) == 0; rb = rb + 1) {
    }
  }
  pMVar1 = as->mcp;
  *(ExitNo *)(pMVar1 + -4) =
       ((exitno & 0x1f) * 4 + *(int *)(as->J->exitstubgroup + (exitno >> 5))) - (int)pMVar1;
  pMVar1[-6] = '\x0f';
  pMVar1[-5] = 0x82;
  as->mcp = pMVar1 + -6;
  if (allow == 0) {
    emit_rmro(as,XO_MOV,0x80200,4,0);
    rb = 0;
  }
  else {
    as->modset = as->modset | 1 << ((byte)rb & 0x1f);
  }
  rb_00 = rb | 0x80200;
  emit_gri(as,0x838107,rb_00,topslot << 3);
  if (r2 == rb || 0x7f < r2) {
    emit_rmro(as,0x2b0000fe,rb_00,0xe,-0xe08);
  }
  else {
    emit_rr(as,0x2b0000fe,rb_00,r2);
  }
  emit_rmro(as,XO_MOV,rb_00,rb,0x30);
  emit_rma(as,XO_MOV,rb_00,as->J[-1].penalty + 0x3a);
  if (allow == 0) {
    emit_rmro(as,XO_MOVto,rb_00,4,0);
    return;
  }
  return;
}

Assistant:

static void asm_stack_check(ASMState *as, BCReg topslot,
			    IRIns *irp, RegSet allow, ExitNo exitno)
{
  /* Try to get an unused temp. register, otherwise spill/restore eax. */
  Reg pbase = irp ? irp->r : RID_BASE;
  Reg r = allow ? rset_pickbot(allow) : RID_EAX;
  emit_jcc(as, CC_B, exitstub_addr(as->J, exitno));
  if (allow == RSET_EMPTY)  /* Restore temp. register. */
    emit_rmro(as, XO_MOV, r|REX_64, RID_ESP, 0);
  else
    ra_modified(as, r);
  emit_gri(as, XG_ARITHi(XOg_CMP), r|REX_GC64, (int32_t)(8*topslot));
  if (ra_hasreg(pbase) && pbase != r)
    emit_rr(as, XO_ARITH(XOg_SUB), r|REX_GC64, pbase);
  else
#if LJ_GC64
    emit_rmro(as, XO_ARITH(XOg_SUB), r|REX_64, RID_DISPATCH,
	      (int32_t)dispofs(as, &J2G(as->J)->jit_base));
#else
    emit_rmro(as, XO_ARITH(XOg_SUB), r, RID_NONE,
	      ptr2addr(&J2G(as->J)->jit_base));
#endif
  emit_rmro(as, XO_MOV, r|REX_GC64, r, offsetof(lua_State, maxstack));
  emit_getgl(as, r, cur_L);
  if (allow == RSET_EMPTY)  /* Spill temp. register. */
    emit_rmro(as, XO_MOVto, r|REX_64, RID_ESP, 0);
}